

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

unique_ptr<QPDF,_std::default_delete<QPDF>_> __thiscall QPDFJob::createQPDF(QPDFJob *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  pointer puVar3;
  _Head_base<0UL,_QPDF_*,_false> oh;
  bool bVar4;
  QPDFJob *in_RSI;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> *foreign;
  pointer puVar5;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> pdf_sp;
  QPDFObjectHandle info;
  QPDFObjectHandle trailer;
  QPDFObjectHandle mod_date;
  vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
  page_heap;
  string local_d0;
  _Head_base<0UL,_QPDF_*,_false> local_b0;
  QPDFObjectHandle local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  QPDFObjectHandle local_68;
  vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
  local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  checkConfiguration(in_RSI);
  local_b0._M_head_impl = (QPDF *)0x0;
  peVar2 = (in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  processFile(in_RSI,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&local_b0,
              (peVar2->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              (peVar2->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true,
              true);
  oh._M_head_impl = local_b0._M_head_impl;
  bVar4 = QPDF::isEncrypted(local_b0._M_head_impl);
  if (bVar4) {
    ((in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    encryption_status = 1;
  }
  peVar2 = (in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2->check_is_encrypted == false) && (peVar2->check_requires_password != true)) {
    if ((peVar2->update_from_json)._M_string_length != 0) {
      QPDF::updateFromJSON(oh._M_head_impl,&peVar2->update_from_json);
    }
    local_58.
    super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    peVar2 = (in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->page_specs).
        super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
        super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&(peVar2->page_specs).
                 super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
                 super__Vector_impl_data + 8)) {
      handlePageSpecs(in_RSI,oh._M_head_impl,&local_58);
    }
    if (*(size_t *)
         ((long)&(((in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->rotations)._M_t._M_impl.super__Rb_tree_header + 0x20) != 0) {
      handleRotations(in_RSI,oh._M_head_impl);
    }
    handleUnderOverlay(in_RSI,oh._M_head_impl);
    handleTransformations(in_RSI,oh._M_head_impl);
    if (((in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        remove_info == true) {
      QPDF::getTrailer(oh._M_head_impl);
      paVar1 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/Info","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_88,(string *)(local_88 + 0x10));
      local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/ModDate","");
      QPDFObjectHandle::getKeyIfDict(&local_68,(string *)local_88);
      if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_98) {
        operator_delete(local_a8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_98._0_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      bVar4 = QPDFObjectHandle::isNull(&local_68);
      if (bVar4) {
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/Info","");
        QPDFObjectHandle::removeKey((QPDFObjectHandle *)(local_88 + 0x10),&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/Info","");
        QPDFObjectHandle::newDictionary();
        QPDF::makeIndirectObject((QPDF *)local_88,(QPDFObjectHandle *)oh._M_head_impl);
        QPDFObjectHandle::replaceKeyAndGetNew
                  (&local_a8,(string *)(local_88 + 0x10),(QPDFObjectHandle *)&local_d0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        }
        if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/ModDate","");
        QPDFObjectHandle::replaceKey(&local_a8,&local_d0,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      QPDF::getRoot((QPDF *)&local_a8);
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/Metadata","");
      QPDFObjectHandle::removeKey(&local_a8,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_);
      }
    }
    if (((in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        remove_metadata == true) {
      QPDF::getRoot((QPDF *)&local_a8);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/Metadata","");
      QPDFObjectHandle::removeKey(&local_a8,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    puVar5 = local_58.
             super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = local_58.
             super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        remove_structure == true) {
      QPDF::getRoot((QPDF *)&local_a8);
      paVar1 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/StructTreeRoot","");
      QPDFObjectHandle::removeKey(&local_a8,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      QPDF::getRoot((QPDF *)&local_a8);
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/MarkInfo","");
      QPDFObjectHandle::removeKey(&local_a8,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      puVar5 = local_58.
               super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = local_58.
               super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        puVar5 = local_58.
                 super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = local_58.
                 super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    for (; puVar5 != puVar3; puVar5 = puVar5 + 1) {
      bVar4 = QPDF::anyWarnings((puVar5->_M_t).
                                super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                                super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                                super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
      if (bVar4) {
        ((in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        warnings = true;
      }
    }
    (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._M_head_impl;
    local_b0._M_head_impl = (QPDF *)0x0;
    std::
    vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
    ::~vector(&local_58);
  }
  else {
    (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
            ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&local_b0);
  return (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)
         (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)this;
}

Assistant:

std::unique_ptr<QPDF>
QPDFJob::createQPDF()
{
    checkConfiguration();
    std::unique_ptr<QPDF> pdf_sp;
    try {
        processFile(pdf_sp, m->infilename.get(), m->password.get(), true, true);
    } catch (QPDFExc& e) {
        if (e.getErrorCode() == qpdf_e_password) {
            // Allow certain operations to work when an incorrect password is supplied.
            if (m->check_is_encrypted || m->check_requires_password) {
                m->encryption_status = qpdf_es_encrypted | qpdf_es_password_incorrect;
                return nullptr;
            }
            if (m->show_encryption && pdf_sp) {
                m->log->info("Incorrect password supplied\n");
                showEncryption(*pdf_sp);
                return nullptr;
            }
        }
        throw;
    }
    QPDF& pdf = *pdf_sp;
    if (pdf.isEncrypted()) {
        m->encryption_status = qpdf_es_encrypted;
    }

    if (m->check_is_encrypted || m->check_requires_password) {
        return nullptr;
    }

    // If we are updating from JSON, this has to be done first before other options may cause
    // transformations to the input.
    if (!m->update_from_json.empty()) {
        pdf.updateFromJSON(m->update_from_json);
    }

    std::vector<std::unique_ptr<QPDF>> page_heap;
    if (!m->page_specs.empty()) {
        handlePageSpecs(pdf, page_heap);
    }
    if (!m->rotations.empty()) {
        handleRotations(pdf);
    }
    handleUnderOverlay(pdf);
    handleTransformations(pdf);
    if (m->remove_info) {
        auto trailer = pdf.getTrailer();
        auto mod_date = trailer.getKey("/Info").getKeyIfDict("/ModDate");
        if (mod_date.isNull()) {
            trailer.removeKey("/Info");
        } else {
            auto info = trailer.replaceKeyAndGetNew(
                "/Info", pdf.makeIndirectObject(QPDFObjectHandle::newDictionary()));
            info.replaceKey("/ModDate", mod_date);
        }
        pdf.getRoot().removeKey("/Metadata");
    }
    if (m->remove_metadata) {
        pdf.getRoot().removeKey("/Metadata");
    }
    if (m->remove_structure) {
        pdf.getRoot().removeKey("/StructTreeRoot");
        pdf.getRoot().removeKey("/MarkInfo");
    }

    for (auto& foreign: page_heap) {
        if (foreign->anyWarnings()) {
            m->warnings = true;
        }
    }
    return pdf_sp;
}